

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileOptions::Swap(FileOptions *this,FileOptions *other)

{
  FileOptions *other_local;
  FileOptions *this_local;
  
  if (other != this) {
    std::swap<std::__cxx11::string*>(&this->java_package_,&other->java_package_);
    std::swap<std::__cxx11::string*>(&this->java_outer_classname_,&other->java_outer_classname_);
    std::swap<bool>(&this->java_multiple_files_,&other->java_multiple_files_);
    std::swap<bool>(&this->java_generate_equals_and_hash_,&other->java_generate_equals_and_hash_);
    std::swap<int>(&this->optimize_for_,&other->optimize_for_);
    std::swap<std::__cxx11::string*>(&this->go_package_,&other->go_package_);
    std::swap<bool>(&this->cc_generic_services_,&other->cc_generic_services_);
    std::swap<bool>(&this->java_generic_services_,&other->java_generic_services_);
    std::swap<bool>(&this->py_generic_services_,&other->py_generic_services_);
    RepeatedPtrField<google::protobuf::UninterpretedOption>::Swap
              (&this->uninterpreted_option_,&other->uninterpreted_option_);
    std::swap<unsigned_int>(this->_has_bits_,other->_has_bits_);
    UnknownFieldSet::Swap(&this->_unknown_fields_,&other->_unknown_fields_);
    std::swap<int>(&this->_cached_size_,&other->_cached_size_);
    internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  }
  return;
}

Assistant:

void FileOptions::Swap(FileOptions* other) {
  if (other != this) {
    std::swap(java_package_, other->java_package_);
    std::swap(java_outer_classname_, other->java_outer_classname_);
    std::swap(java_multiple_files_, other->java_multiple_files_);
    std::swap(java_generate_equals_and_hash_, other->java_generate_equals_and_hash_);
    std::swap(optimize_for_, other->optimize_for_);
    std::swap(go_package_, other->go_package_);
    std::swap(cc_generic_services_, other->cc_generic_services_);
    std::swap(java_generic_services_, other->java_generic_services_);
    std::swap(py_generic_services_, other->py_generic_services_);
    uninterpreted_option_.Swap(&other->uninterpreted_option_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
    _extensions_.Swap(&other->_extensions_);
  }
}